

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O1

void check_less<char[1],booster::sub_match<char_const*>>(char (*a) [1],sub_match<const_char_*> b)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  ostringstream oss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  iVar1 = booster::sub_match<const_char_*>::compare(&b,*a);
  if (iVar1 < 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," a<b",4);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = booster::sub_match<const_char_*>::compare(&b,*a);
  if (iVar1 < 1) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," a<=b",5);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = booster::sub_match<const_char_*>::compare(&b,*a);
  if (iVar1 < 1) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," !(a>b)",7);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = booster::sub_match<const_char_*>::compare(&b,*a);
  if (iVar1 < 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x31);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," !(a>=b)",8);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = booster::sub_match<const_char_*>::compare(&b,*a);
  if (iVar1 < 1) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," b>a",4);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = booster::sub_match<const_char_*>::compare(&b,*a);
  if (iVar1 < 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," b>=a",5);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = booster::sub_match<const_char_*>::compare(&b,*a);
  if (iVar1 < 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x34);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," !(b<a)",7);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = booster::sub_match<const_char_*>::compare(&b,*a);
  if (0 < iVar1) {
    iVar1 = booster::sub_match<const_char_*>::compare(&b,*a);
    if (iVar1 == 0) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x36);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," a!=b",5);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,local_1b0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = booster::sub_match<const_char_*>::compare(&b,*a);
    if (iVar1 == 0) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x37);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," b!=a",5);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,local_1b0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = booster::sub_match<const_char_*>::compare(&b,*a);
    if (iVar1 == 0) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," !(a==b)",8);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,local_1b0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = booster::sub_match<const_char_*>::compare(&b,*a);
    if (iVar1 != 0) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x39);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," !(b==a)",8);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
             ,0x6e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x35);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," !(b<=a)",8);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,local_1b0);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_less(Match const &a,Other b)
{
	TEST(a<b);
	TEST(a<=b);
	TEST(!(a>b));
	TEST(!(a>=b));
	TEST(b>a);
	TEST(b>=a);
	TEST(!(b<a));
	TEST(!(b<=a));
	TEST(a!=b);
	TEST(b!=a);
	TEST(!(a==b));
	TEST(!(b==a));
}